

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyImplPrivate::emitUploadProgress
          (QNetworkReplyImplPrivate *this,qint64 bytesSent,qint64 bytesTotal)

{
  QNetworkReply *this_00;
  long lVar1;
  char cVar2;
  
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  this->bytesUploaded = bytesSent;
  if ((this->super_QNetworkReplyPrivate).emitAllUploadProgressSignals == false) {
    cVar2 = QElapsedTimer::isValid();
    if (bytesSent != bytesTotal && cVar2 == '\x01') {
      lVar1 = QElapsedTimer::elapsed();
      if (lVar1 < 100) {
        return;
      }
    }
    QElapsedTimer::start();
  }
  this->notificationHandlingPaused = true;
  QNetworkReply::uploadProgress(this_00,bytesSent,bytesTotal);
  resumeNotificationHandling(this);
  return;
}

Assistant:

void QNetworkReplyImplPrivate::emitUploadProgress(qint64 bytesSent, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyImpl);
    bytesUploaded = bytesSent;

    if (!emitAllUploadProgressSignals) {
        //choke signal emissions, except the first and last signals which are unconditional
        if (uploadProgressSignalChoke.isValid()) {
            if (bytesSent != bytesTotal && uploadProgressSignalChoke.elapsed() < progressSignalInterval) {
                return;
            }
        }
        uploadProgressSignalChoke.start();
    }

    pauseNotificationHandling();
    emit q->uploadProgress(bytesSent, bytesTotal);
    resumeNotificationHandling();
}